

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O3

ssize_t __thiscall
serial::Serial::SerialImpl::write(SerialImpl *this,int __fd,void *__buf,size_t __n)

{
  uint __fd_00;
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ssize_t sVar6;
  int *piVar7;
  PortNotOpenedException *this_00;
  IOException *pIVar8;
  code *pcVar9;
  bool bVar10;
  undefined4 in_register_00000034;
  pointer_____offset_0x10___ *ppuVar11;
  void *pvVar12;
  timespec timeout;
  MillisecondTimer total_timeout;
  fd_set writefds;
  timespec local_120;
  long local_110;
  MillisecondTimer local_108;
  string local_f8;
  string local_d8;
  fd_set local_b8;
  
  local_110 = CONCAT44(in_register_00000034,__fd);
  if (this->is_open_ == false) {
    this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x48);
    PortNotOpenedException::PortNotOpenedException(this_00,"Serial::write");
    ppuVar11 = &PortNotOpenedException::typeinfo;
    pcVar9 = PortNotOpenedException::~PortNotOpenedException;
LAB_0010980d:
    __cxa_throw(this_00,ppuVar11,pcVar9);
  }
  MillisecondTimer::MillisecondTimer
            (&local_108,
             (this->timeout_).write_timeout_multiplier * (int)__buf +
             (this->timeout_).write_timeout_constant);
  if (__buf == (void *)0x0) {
    pvVar12 = (void *)0x0;
  }
  else {
    bVar10 = true;
    pvVar12 = (void *)0x0;
    do {
      clock_gettime(1,&local_120);
      uVar5 = (ulong)((double)(long)((double)(local_108.expiry.tv_sec - local_120.tv_sec) * 1000.0)
                     + (double)(local_108.expiry.tv_nsec - local_120.tv_nsec) / 1000000.0);
      if ((!bVar10) && ((long)uVar5 < 1)) {
        return (ssize_t)pvVar12;
      }
      dVar1 = (double)(uVar5 & 0xffffffff);
      local_120.tv_sec = (__time_t)(dVar1 / 1000.0);
      local_120.tv_nsec = (long)((dVar1 - (double)local_120.tv_sec * 1000.0) * 1000000.0);
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      iVar3 = this->fd_;
      iVar2 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      local_b8.fds_bits[iVar2 >> 6] =
           local_b8.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar3 % 0x40) & 0x3f);
      iVar3 = pselect(iVar3 + 1,(fd_set *)0x0,&local_b8,(fd_set *)0x0,&local_120,(__sigset_t *)0x0);
      if (-1 < iVar3) {
        if (iVar3 == 0) {
          return (ssize_t)pvVar12;
        }
        __fd_00 = this->fd_;
        uVar4 = __fd_00 + 0x3f;
        if (-1 < (int)__fd_00) {
          uVar4 = __fd_00;
        }
        if (((ulong)local_b8.fds_bits[(int)uVar4 >> 6] >> ((ulong)__fd_00 & 0x3f) & 1) == 0) {
LAB_00109815:
          pIVar8 = (IOException *)__cxa_allocate_exception(0x78);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                     ,"");
          IOException::IOException
                    (pIVar8,&local_f8,0x2b3,
                     "select reports ready to write, but our fd isn\'t in the list, this shouldn\'t happen!"
                    );
          __cxa_throw(pIVar8,&IOException::typeinfo,IOException::~IOException);
        }
        sVar6 = ::write(__fd_00,(void *)(local_110 + (long)pvVar12),(long)__buf - (long)pvVar12);
        if (sVar6 < 1) {
          this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x28);
          SerialException::SerialException
                    ((SerialException *)this_00,
                     "device reports readiness to write but returned no data (device disconnected?)"
                    );
        }
        else {
          pvVar12 = (void *)((long)pvVar12 + sVar6);
          if (pvVar12 == __buf) {
            return (ssize_t)__buf;
          }
          if (pvVar12 < __buf) goto LAB_00109799;
          if (pvVar12 <= __buf) goto LAB_00109815;
          this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x28);
          SerialException::SerialException
                    ((SerialException *)this_00,
                     "write over wrote, too many bytes where written, this shouldn\'t happen, might be a logical error!"
                    );
        }
        ppuVar11 = &SerialException::typeinfo;
        pcVar9 = SerialException::~SerialException;
        goto LAB_0010980d;
      }
      piVar7 = __errno_location();
      if (*piVar7 != 4) {
        pIVar8 = (IOException *)__cxa_allocate_exception(0x78);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                   ,"");
        IOException::IOException(pIVar8,&local_d8,0x28a,*piVar7);
        __cxa_throw(pIVar8,&IOException::typeinfo,IOException::~IOException);
      }
LAB_00109799:
      bVar10 = false;
    } while (pvVar12 < __buf);
  }
  return (ssize_t)pvVar12;
}

Assistant:

size_t
Serial::SerialImpl::write (const uint8_t *data, size_t length)
{
  if (is_open_ == false) {
    throw PortNotOpenedException ("Serial::write");
  }
  fd_set writefds;
  size_t bytes_written = 0;

  // Calculate total timeout in milliseconds t_c + (t_m * N)
  long total_timeout_ms = timeout_.write_timeout_constant;
  total_timeout_ms += timeout_.write_timeout_multiplier * static_cast<long> (length);
  MillisecondTimer total_timeout(total_timeout_ms);

  bool first_iteration = true;
  while (bytes_written < length) {
    int64_t timeout_remaining_ms = total_timeout.remaining();
    // Only consider the timeout if it's not the first iteration of the loop
    // otherwise a timeout of 0 won't be allowed through
    if (!first_iteration && (timeout_remaining_ms <= 0)) {
      // Timed out
      break;
    }
    first_iteration = false;

    timespec timeout(timespec_from_ms(timeout_remaining_ms));

    FD_ZERO (&writefds);
    FD_SET (fd_, &writefds);

    // Do the select
    int r = pselect (fd_ + 1, NULL, &writefds, NULL, &timeout, NULL);

    // Figure out what happened by looking at select's response 'r'
    /** Error **/
    if (r < 0) {
      // Select was interrupted, try again
      if (errno == EINTR) {
        continue;
      }
      // Otherwise there was some error
      THROW (IOException, errno);
    }
    /** Timeout **/
    if (r == 0) {
      break;
    }
    /** Port ready to write **/
    if (r > 0) {
      // Make sure our file descriptor is in the ready to write list
      if (FD_ISSET (fd_, &writefds)) {
        // This will write some
        ssize_t bytes_written_now =
          ::write (fd_, data + bytes_written, length - bytes_written);
        // write should always return some data as select reported it was
        // ready to write when we get to this point.
        if (bytes_written_now < 1) {
          // Disconnected devices, at least on Linux, show the
          // behavior that they are always ready to write immediately
          // but writing returns nothing.
          throw SerialException ("device reports readiness to write but "
                                 "returned no data (device disconnected?)");
        }
        // Update bytes_written
        bytes_written += static_cast<size_t> (bytes_written_now);
        // If bytes_written == size then we have written everything we need to
        if (bytes_written == length) {
          break;
        }
        // If bytes_written < size then we have more to write
        if (bytes_written < length) {
          continue;
        }
        // If bytes_written > size then we have over written, which shouldn't happen
        if (bytes_written > length) {
          throw SerialException ("write over wrote, too many bytes where "
                                 "written, this shouldn't happen, might be "
                                 "a logical error!");
        }
      }
      // This shouldn't happen, if r > 0 our fd has to be in the list!
      THROW (IOException, "select reports ready to write, but our fd isn't"
                          " in the list, this shouldn't happen!");
    }
  }
  return bytes_written;
}